

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2PFileSender.cpp
# Opt level: O0

void __thiscall P2PFileSenderConnection::OnTick(P2PFileSenderConnection *this,uint64_t nowUsec)

{
  ulong *puVar1;
  undefined8 *puVar2;
  ulong *puVar3;
  long in_RSI;
  long in_RDI;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  LogStringBuffer buffer;
  LogStringBuffer buffer_1;
  LogStringBuffer buffer_2;
  char *in_stack_fffffffffffff1c8;
  LogStringBuffer *in_stack_fffffffffffff1d0;
  LogStringBuffer *in_stack_fffffffffffff208;
  LogStringBuffer *buffer_00;
  OutputWorker *in_stack_fffffffffffff210;
  Channel *pCVar6;
  LogStringBuffer *this_00;
  undefined4 local_cec;
  double local_cd0;
  float local_cc4;
  long local_cc0;
  char *local_cb0;
  Channel *local_ca8;
  char *local_ca0;
  Channel *local_c98;
  char *local_c90;
  double *local_c88;
  char *local_c80;
  float *local_c78;
  char *local_c70;
  ulong *local_c68;
  char *local_c60;
  ulong *local_c58;
  char *local_c50;
  undefined8 *local_c48;
  char *local_c40;
  Channel *local_c38;
  char *local_c30;
  undefined4 local_c24;
  Channel *local_c20;
  undefined4 local_c14;
  Channel *local_c10;
  undefined1 local_bf8 [16];
  ostream aoStack_be8 [376];
  char *local_a70;
  undefined4 local_a64;
  Channel *local_a60;
  char *local_a58;
  undefined8 local_a50;
  undefined1 *local_a48;
  Channel *local_a40;
  undefined8 local_a38;
  undefined1 *local_a30;
  Channel *local_a28;
  undefined8 local_a20;
  undefined1 *local_a18;
  char *local_a10;
  undefined1 *local_a08;
  Channel *local_a00;
  char *local_9f8;
  undefined1 *local_9f0;
  char *local_9e8;
  undefined4 local_9dc;
  Channel *local_9d8;
  undefined4 local_9cc;
  Channel *local_9c8;
  undefined1 local_9b0 [16];
  ostream aoStack_9a0 [376];
  char *local_828;
  undefined4 local_81c;
  Channel *local_818;
  char *local_810;
  undefined8 local_808;
  undefined1 *local_800;
  Channel *local_7f8;
  undefined8 local_7f0;
  undefined1 *local_7e8;
  Channel *local_7e0;
  undefined8 local_7d8;
  undefined1 *local_7d0;
  char *local_7c8;
  undefined1 *local_7c0;
  Channel *local_7b8;
  char *local_7b0;
  undefined1 *local_7a8;
  char *local_7a0;
  double *local_798;
  char *local_790;
  float *local_788;
  char *local_780;
  ulong *local_778;
  char *local_770;
  ulong *local_768;
  char *local_760;
  undefined8 *local_758;
  char *local_750;
  undefined4 local_744;
  Channel *local_740;
  undefined4 local_734;
  Channel *local_730;
  undefined1 local_718 [16];
  ostream aoStack_708 [376];
  char *local_590;
  double *local_588;
  char *local_580;
  float *local_578;
  char *local_570;
  ulong *local_568;
  char *local_560;
  ulong *local_558;
  char *local_550;
  undefined8 *local_548;
  char *local_540;
  undefined4 local_534;
  Channel *local_530;
  char *local_528;
  double *local_520;
  char *local_518;
  float *local_510;
  char *local_508;
  ulong *local_500;
  char *local_4f8;
  ulong *local_4f0;
  char *local_4e8;
  undefined8 *local_4e0;
  char *local_4d8;
  undefined8 local_4d0;
  undefined1 *local_4c8;
  Channel *local_4c0;
  undefined8 local_4b8;
  undefined1 *local_4b0;
  Channel *local_4a8;
  undefined8 local_4a0;
  undefined1 *local_498;
  char *local_490;
  double *local_488;
  char *local_480;
  float *local_478;
  char *local_470;
  ulong *local_468;
  char *local_460;
  ulong *local_458;
  char *local_450;
  undefined8 *local_448;
  char *local_440;
  undefined1 *local_438;
  Channel *local_430;
  char *local_428;
  undefined1 *local_420;
  Channel *local_418;
  char *local_410;
  double *local_408;
  char *local_400;
  float *local_3f8;
  char *local_3f0;
  ulong *local_3e8;
  char *local_3e0;
  ulong *local_3d8;
  char *local_3d0;
  undefined8 *local_3c8;
  undefined1 *local_3c0;
  Channel *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined8 *local_3a0;
  undefined1 *local_398;
  Channel *local_390;
  char *local_388;
  double *local_380;
  char *local_378;
  float *local_370;
  char *local_368;
  ulong *local_360;
  char *local_358;
  ulong *local_350;
  char *local_348;
  undefined1 *local_340;
  Channel *local_338;
  undefined8 *local_330;
  undefined1 *local_328;
  char *local_320;
  undefined1 *local_318;
  Channel *local_310;
  char *local_308;
  double *local_300;
  char *local_2f8;
  float *local_2f0;
  char *local_2e8;
  ulong *local_2e0;
  char *local_2d8;
  ulong *local_2d0;
  undefined1 *local_2c8;
  LogStringBuffer *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  ulong *local_2a8;
  undefined1 *local_2a0;
  LogStringBuffer *local_298;
  char *local_290;
  double *local_288;
  char *local_280;
  float *local_278;
  char *local_270;
  ulong *local_268;
  char *local_260;
  undefined1 *local_258;
  LogStringBuffer *local_250;
  char *local_248;
  undefined1 *local_240;
  LogStringBuffer *local_238;
  char *local_230;
  undefined1 *local_228;
  ulong *local_220;
  undefined1 *local_218;
  char *local_210;
  double *local_208;
  char *local_200;
  float *local_1f8;
  char *local_1f0;
  ulong *local_1e8;
  undefined1 *local_1e0;
  LogStringBuffer *local_1d8;
  ulong *local_1d0;
  undefined1 *local_1c8;
  LogStringBuffer *local_1c0;
  ulong *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  double *local_1a0;
  char *local_198;
  float *local_190;
  char *local_188;
  undefined1 *local_180;
  LogStringBuffer *local_178;
  char *local_170;
  undefined1 *local_168;
  LogStringBuffer *local_160;
  char *local_158;
  double *local_150;
  char *local_148;
  float *local_140;
  undefined1 *local_138;
  LogStringBuffer *local_130;
  char *local_128;
  undefined1 *local_120;
  float *local_118;
  undefined1 *local_110;
  LogStringBuffer *local_108;
  char *local_100;
  double *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  LogStringBuffer *local_e0;
  float *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  LogStringBuffer *local_b8;
  char *local_b0;
  double *local_a8;
  undefined1 *local_a0;
  LogStringBuffer *local_98;
  char *local_90;
  undefined1 *local_88;
  LogStringBuffer *local_80;
  char *local_78;
  undefined1 *local_70;
  char *local_68;
  undefined1 *local_60;
  double *local_58;
  undefined1 *local_50;
  LogStringBuffer *local_48;
  double *local_40;
  undefined1 *local_38;
  
  auVar5 = in_ZMM1._0_16_;
  auVar4 = in_ZMM0._0_16_;
  if (*(long *)(in_RDI + 0x38) != 0) {
    local_cc0 = in_RSI;
    tonk_file_send((TonkFile)0x104d8d);
    if ((*(uint *)(*(long *)(in_RDI + 0x38) + 0x10) & 1) != 0) {
      if ((*(uint *)(*(long *)(in_RDI + 0x38) + 0x10) & 2) == 0) {
        local_c98 = &Logger;
        local_ca0 = "File transfer completed";
        local_9d8 = &Logger;
        local_9dc = 2;
        local_9e8 = "File transfer completed";
        local_9c8 = &Logger;
        local_9cc = 2;
        if ((int)Logger.ChannelMinLevel < 3) {
          local_818 = &Logger;
          local_81c = 2;
          local_828 = "File transfer completed";
          logger::LogStringBuffer::LogStringBuffer
                    (in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8,Trace);
          local_808 = 0x119318;
          local_7f8 = &Logger;
          local_810 = local_828;
          local_7e0 = &Logger;
          local_800 = local_9b0;
          local_7f0 = local_808;
          local_7e8 = local_9b0;
          local_7d8 = local_808;
          local_7d0 = local_9b0;
          std::operator<<(aoStack_9a0,(string *)&Logger.Prefix);
          local_7b8 = &Logger;
          local_7c0 = local_800;
          local_7c8 = local_810;
          local_7a8 = local_800;
          local_7b0 = local_810;
          std::operator<<((ostream *)(local_800 + 0x10),local_810);
          logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(in_stack_fffffffffffff210,in_stack_fffffffffffff208);
          logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1052a4);
        }
      }
      else {
        local_ca8 = &Logger;
        local_cb0 = "File transfer failed";
        local_c20 = &Logger;
        local_c24 = 4;
        local_c30 = "File transfer failed";
        local_c10 = &Logger;
        local_c14 = 4;
        if ((int)Logger.ChannelMinLevel < 5) {
          local_a60 = &Logger;
          local_a64 = 4;
          local_a70 = "File transfer failed";
          logger::LogStringBuffer::LogStringBuffer
                    (in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8,Trace);
          local_a50 = 0x119318;
          local_a40 = &Logger;
          local_a58 = local_a70;
          local_a28 = &Logger;
          local_a48 = local_bf8;
          local_a38 = local_a50;
          local_a30 = local_bf8;
          local_a20 = local_a50;
          local_a18 = local_bf8;
          std::operator<<(aoStack_be8,(string *)&Logger.Prefix);
          local_a00 = &Logger;
          local_a08 = local_a48;
          local_a10 = local_a58;
          local_9f0 = local_a48;
          local_9f8 = local_a58;
          std::operator<<((ostream *)(local_a48 + 0x10),local_a58);
          logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(in_stack_fffffffffffff210,in_stack_fffffffffffff208);
          logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x10502f);
        }
      }
      tonk_file_free((TonkFile)0x1052b7);
      *(undefined8 *)(in_RDI + 0x38) = 0;
    }
    if ((*(long *)(in_RDI + 0x38) != 0) && (1000000 < (ulong)(local_cc0 - *(long *)(in_RDI + 0x40)))
       ) {
      *(long *)(in_RDI + 0x40) = local_cc0;
      puVar2 = (undefined8 *)(*(long *)(in_RDI + 0x38) + 0x18);
      puVar1 = *(ulong **)(in_RDI + 0x38);
      puVar3 = (ulong *)(*(long *)(in_RDI + 0x38) + 8);
      auVar4 = vcvtusi2ss_avx512f(auVar4,**(long **)(in_RDI + 0x38) * 100);
      auVar5 = vcvtusi2ss_avx512f(auVar5,*(undefined8 *)(*(long *)(in_RDI + 0x38) + 8));
      auVar5._0_4_ = auVar4._0_4_ / auVar5._0_4_;
      auVar5._4_12_ = auVar4._4_12_;
      local_cc4 = auVar5._0_4_;
      tonk::SDKConnection::GetStatusEx((SDKConnection *)in_stack_fffffffffffff1d0);
      auVar4 = vcvtusi2sd_avx512f(auVar5,local_cec);
      local_cd0 = auVar4._0_8_ / 1000.0;
      local_c38 = &Logger;
      local_c40 = "File(";
      local_c50 = ") progress: ";
      local_c60 = " / ";
      local_c70 = " Bytes (";
      local_c78 = &local_cc4;
      local_c80 = "%).  Received by peer at ";
      local_c88 = &local_cd0;
      local_c90 = " KBPS";
      local_740 = &Logger;
      local_744 = 2;
      local_750 = "File(";
      local_760 = ") progress: ";
      local_770 = " / ";
      local_780 = " Bytes (";
      local_790 = "%).  Received by peer at ";
      local_7a0 = " KBPS";
      local_730 = &Logger;
      local_734 = 2;
      if ((int)Logger.ChannelMinLevel < 3) {
        local_530 = &Logger;
        local_534 = 2;
        local_540 = "File(";
        local_550 = ") progress: ";
        local_560 = " / ";
        local_570 = " Bytes (";
        local_580 = "%).  Received by peer at ";
        local_590 = " KBPS";
        local_c68 = puVar3;
        local_c58 = puVar1;
        local_c48 = puVar2;
        local_798 = local_c88;
        local_788 = local_c78;
        local_778 = puVar3;
        local_768 = puVar1;
        local_758 = puVar2;
        local_588 = local_c88;
        local_578 = local_c78;
        local_568 = puVar3;
        local_558 = puVar1;
        local_548 = puVar2;
        logger::LogStringBuffer::LogStringBuffer
                  (in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8,Trace);
        local_4d0 = 0x119318;
        local_4c0 = &Logger;
        local_4d8 = local_540;
        local_4e0 = local_548;
        local_4e8 = local_550;
        local_4f0 = local_558;
        local_4f8 = local_560;
        local_500 = local_568;
        local_508 = local_570;
        local_510 = local_578;
        local_518 = local_580;
        local_520 = local_588;
        local_528 = local_590;
        local_4a8 = &Logger;
        local_4c8 = local_718;
        local_4b8 = local_4d0;
        local_4b0 = local_718;
        local_4a0 = local_4d0;
        local_498 = local_718;
        std::operator<<(aoStack_708,(string *)&Logger.Prefix);
        local_430 = &Logger;
        local_438 = local_4c8;
        local_440 = local_4d8;
        local_448 = local_4e0;
        local_450 = local_4e8;
        local_458 = local_4f0;
        local_460 = local_4f8;
        local_468 = local_500;
        local_470 = local_508;
        local_478 = local_510;
        local_480 = local_518;
        local_488 = local_520;
        local_490 = local_528;
        local_418 = &Logger;
        local_420 = local_4c8;
        local_428 = local_4d8;
        local_3a8 = local_4c8;
        local_3b0 = local_4d8;
        std::operator<<((ostream *)(local_4c8 + 0x10),local_4d8);
        local_3b8 = &Logger;
        local_3c0 = local_438;
        local_3c8 = local_448;
        local_3d0 = local_450;
        local_3d8 = local_458;
        local_3e0 = local_460;
        local_3e8 = local_468;
        local_3f0 = local_470;
        local_3f8 = local_478;
        local_400 = local_480;
        local_408 = local_488;
        local_410 = local_490;
        local_390 = &Logger;
        local_398 = local_438;
        local_3a0 = local_448;
        local_328 = local_438;
        local_330 = local_448;
        std::operator<<((ostream *)(local_438 + 0x10),(char *)*local_448);
        local_338 = &Logger;
        local_340 = local_3c0;
        local_348 = local_3d0;
        local_350 = local_3d8;
        local_358 = local_3e0;
        local_360 = local_3e8;
        local_368 = local_3f0;
        local_370 = local_3f8;
        local_378 = local_400;
        local_380 = local_408;
        local_388 = local_410;
        pCVar6 = &Logger;
        local_310 = &Logger;
        local_318 = local_3c0;
        local_320 = local_3d0;
        local_2b0 = local_3c0;
        local_2b8 = local_3d0;
        std::operator<<((ostream *)(local_3c0 + 0x10),local_3d0);
        local_2c8 = local_340;
        local_2d0 = local_350;
        local_2d8 = local_358;
        local_2e0 = local_360;
        local_2e8 = local_368;
        local_2f0 = local_370;
        local_2f8 = local_378;
        local_300 = local_380;
        local_308 = local_388;
        local_2a0 = local_340;
        local_2a8 = local_350;
        local_218 = local_340;
        local_220 = local_350;
        this_00 = (LogStringBuffer *)pCVar6;
        local_2c0 = (LogStringBuffer *)pCVar6;
        local_298 = (LogStringBuffer *)pCVar6;
        std::ostream::operator<<((ostream *)(local_340 + 0x10),*local_350);
        local_258 = local_2c8;
        local_260 = local_2d8;
        local_268 = local_2e0;
        local_270 = local_2e8;
        local_278 = local_2f0;
        local_280 = local_2f8;
        local_288 = local_300;
        local_290 = local_308;
        local_240 = local_2c8;
        local_248 = local_2d8;
        local_228 = local_2c8;
        local_230 = local_2d8;
        buffer_00 = (LogStringBuffer *)pCVar6;
        local_250 = (LogStringBuffer *)pCVar6;
        local_238 = (LogStringBuffer *)pCVar6;
        std::operator<<((ostream *)(local_2c8 + 0x10),local_2d8);
        local_1e0 = local_258;
        local_1e8 = local_268;
        local_1f0 = local_270;
        local_1f8 = local_278;
        local_200 = local_280;
        local_208 = local_288;
        local_210 = local_290;
        local_1c8 = local_258;
        local_1d0 = local_268;
        local_1b0 = local_258;
        local_1b8 = local_268;
        local_1d8 = (LogStringBuffer *)pCVar6;
        local_1c0 = (LogStringBuffer *)pCVar6;
        std::ostream::operator<<((ostream *)(local_258 + 0x10),*local_268);
        local_180 = local_1e0;
        local_188 = local_1f0;
        local_190 = local_1f8;
        local_198 = local_200;
        local_1a0 = local_208;
        local_1a8 = local_210;
        local_168 = local_1e0;
        local_170 = local_1f0;
        local_120 = local_1e0;
        local_128 = local_1f0;
        local_178 = (LogStringBuffer *)pCVar6;
        local_160 = (LogStringBuffer *)pCVar6;
        std::operator<<((ostream *)(local_1e0 + 0x10),local_1f0);
        local_138 = local_180;
        local_140 = local_190;
        local_148 = local_198;
        local_150 = local_1a0;
        local_158 = local_1a8;
        local_110 = local_180;
        local_118 = local_190;
        local_d0 = local_180;
        local_d8 = local_190;
        local_130 = (LogStringBuffer *)pCVar6;
        local_108 = (LogStringBuffer *)pCVar6;
        std::ostream::operator<<((ostream *)(local_180 + 0x10),*local_190);
        local_e8 = local_138;
        local_f0 = local_148;
        local_f8 = local_150;
        local_100 = local_158;
        local_c0 = local_138;
        local_c8 = local_148;
        local_60 = local_138;
        local_68 = local_148;
        local_e0 = (LogStringBuffer *)pCVar6;
        local_b8 = (LogStringBuffer *)pCVar6;
        std::operator<<((ostream *)(local_138 + 0x10),local_148);
        local_a0 = local_e8;
        local_a8 = local_f8;
        local_b0 = local_100;
        local_50 = local_e8;
        local_58 = local_f8;
        local_38 = local_e8;
        local_40 = local_f8;
        local_98 = (LogStringBuffer *)pCVar6;
        local_48 = (LogStringBuffer *)pCVar6;
        std::ostream::operator<<((ostream *)(local_e8 + 0x10),*local_f8);
        local_88 = local_a0;
        local_90 = local_b0;
        local_70 = local_a0;
        local_78 = local_b0;
        local_80 = (LogStringBuffer *)pCVar6;
        std::operator<<((ostream *)(local_a0 + 0x10),local_b0);
        logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write((OutputWorker *)this_00,buffer_00);
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x10620b);
      }
    }
  }
  return;
}

Assistant:

void P2PFileSenderConnection::OnTick(
    uint64_t          nowUsec   // Current timestamp in microseconds
)
{
    if (File)
    {
        tonk_file_send(File);

        // If transfer is done we need to call tonk_file_free().
        if (File->Flags & TonkFileFlags_Done)
        {
            if (File->Flags & TonkFileFlags_Failed) {
                Logger.Error("File transfer failed");
            }
            else {
                Logger.Info("File transfer completed");
            }

            tonk_file_free(File);
            File = nullptr;

            // Start sending the next file
            //StartSending();
        }

        // Periodically report progress
        if (File && nowUsec - LastReportUsec > 1000000)
        {
            LastReportUsec = nowUsec;

            Logger.Info("File(", File->Name, ") progress: ", File->ProgressBytes, " / ", File->TotalBytes,
                " Bytes (", File->ProgressBytes * 100 / (float)File->TotalBytes,
                "%).  Received by peer at ", GetStatusEx().PeerSeenBPS / 1000.0, " KBPS");
        }
    }
}